

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynSwitch * ParseSwitch(ParseContext *ctx)

{
  Lexeme *begin;
  IntrusiveList<SynSwitchCase> cases_00;
  bool bVar1;
  int iVar2;
  SynBase *condition;
  undefined4 extraout_var;
  SynBase *value;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Lexeme *pLVar3;
  undefined4 extraout_var_02;
  Lexeme *pLVar4;
  IntrusiveList<SynBase> expressions;
  IntrusiveList<SynSwitchCase> cases;
  
  begin = ctx->currentLexeme;
  if (begin->type != lex_switch) {
    return (SynSwitch *)0x0;
  }
  ctx->currentLexeme = begin + 1;
  anon_unknown.dwarf_153727::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'switch\'");
  condition = ParseAssignment(ctx);
  if (condition == (SynBase *)0x0) {
    anon_unknown.dwarf_153727::Report
              (ctx,ctx->currentLexeme,"ERROR: expression not found after \'switch(\'");
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    condition = (SynBase *)CONCAT44(extraout_var,iVar2);
    SynError::SynError((SynError *)condition,ctx->currentLexeme,ctx->currentLexeme);
  }
  bVar1 = false;
  anon_unknown.dwarf_153727::CheckConsume
            (ctx,lex_cparen,
             "ERROR: closing \')\' not found after expression in \'switch\' statement");
  anon_unknown.dwarf_153727::CheckConsume
            (ctx,lex_ofigure,"ERROR: \'{\' not found after \'switch(...)\'");
  cases.head = (SynSwitchCase *)0x0;
  cases.tail = (SynSwitchCase *)0x0;
  do {
    pLVar4 = ctx->currentLexeme;
    if (pLVar4->type == lex_default) {
      pLVar3 = pLVar4;
      if (bVar1) {
        anon_unknown.dwarf_153727::Report
                  (ctx,pLVar4,"ERROR: default switch case is already defined");
        pLVar3 = ctx->currentLexeme;
        if (pLVar3->type != lex_none) goto LAB_001fc1b1;
      }
      else {
LAB_001fc1b1:
        ctx->currentLexeme = pLVar3 + 1;
      }
      bVar1 = true;
      value = (SynBase *)0x0;
    }
    else {
      if (pLVar4->type != lex_case) {
        anon_unknown.dwarf_153727::CheckConsume
                  (ctx,lex_cfigure,"ERROR: \'}\' not found after \'switch\' statement");
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
        pLVar4 = ParseContext::Previous(ctx);
        cases_00.tail = cases.tail;
        cases_00.head = cases.head;
        SynSwitch::SynSwitch
                  ((SynSwitch *)CONCAT44(extraout_var_02,iVar2),begin,pLVar4,condition,cases_00);
        return (SynSwitch *)CONCAT44(extraout_var_02,iVar2);
      }
      ctx->currentLexeme = pLVar4 + 1;
      if (bVar1) {
        anon_unknown.dwarf_153727::Report
                  (ctx,pLVar4 + 1,"ERROR: default switch case can\'t be followed by more cases");
      }
      value = ParseAssignment(ctx);
      if (value == (SynBase *)0x0) {
        anon_unknown.dwarf_153727::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression expected after \'case\'");
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        value = (SynBase *)CONCAT44(extraout_var_00,iVar2);
        SynError::SynError((SynError *)value,ctx->currentLexeme,ctx->currentLexeme);
      }
    }
    anon_unknown.dwarf_153727::CheckConsume(ctx,lex_colon,"ERROR: \':\' expected");
    expressions = ParseExpressions(ctx);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    pLVar3 = ParseContext::Previous(ctx);
    SynSwitchCase::SynSwitchCase
              ((SynSwitchCase *)CONCAT44(extraout_var_01,iVar2),pLVar4,pLVar3,value,expressions);
    IntrusiveList<SynSwitchCase>::push_back(&cases,(SynSwitchCase *)CONCAT44(extraout_var_01,iVar2))
    ;
  } while( true );
}

Assistant:

SynSwitch* ParseSwitch(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_switch))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'switch'");

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after 'switch('");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after expression in 'switch' statement");

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after 'switch(...)'");

		bool hadDefautltCase = false;

		IntrusiveList<SynSwitchCase> cases;

		while(ctx.At(lex_case) || ctx.At(lex_default))
		{
			Lexeme *pos = ctx.currentLexeme;

			SynBase *value = NULL;

			if(ctx.Consume(lex_case))
			{
				if(hadDefautltCase)
					Report(ctx, ctx.Current(), "ERROR: default switch case can't be followed by more cases");

				value = ParseAssignment(ctx);

				if(!value)
				{
					Report(ctx, ctx.Current(), "ERROR: expression expected after 'case'");

					value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
				}
			}
			else
			{
				if(hadDefautltCase)
					Report(ctx, ctx.Current(), "ERROR: default switch case is already defined");

				ctx.Skip();

				hadDefautltCase = true;
			}

			CheckConsume(ctx, lex_colon, "ERROR: ':' expected");

			IntrusiveList<SynBase> expressions = ParseExpressions(ctx);

			cases.push_back(new (ctx.get<SynSwitchCase>()) SynSwitchCase(pos, ctx.Previous(), value, expressions));
		}

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after 'switch' statement");

		return new (ctx.get<SynSwitch>()) SynSwitch(start, ctx.Previous(), condition, cases);
	}

	return NULL;
}